

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_over_exert(player *p,wchar_t flag,wchar_t chance,wchar_t amount)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  uint32_t uVar4;
  char dam_text [32];
  char local_48 [32];
  
  if (L'\0' < chance) {
    if (((flag & 1U) != 0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
      uVar4 = Rand_div(100);
      msg("You have damaged your health!");
      player_stat_dec(p,L'\x04',0x31 < (uint)chance && (int)uVar4 < (int)((uint)chance >> 1));
    }
    if (((flag & 2U) != 0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
      msg("You faint from the effort!");
      uVar4 = Rand_div(amount);
      player_inc_timed(p,L'\x03',uVar4 + L'\x01',true,true,false);
    }
    if (((flag & 4U) != 0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
      uVar4 = Rand_div(amount);
      player_inc_timed(p,L'\x1f',uVar4 + L'\x01',true,true,true);
    }
    if (((flag & 8U) != 0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
      msg("Wounds appear on your body!");
      uVar4 = Rand_div(amount);
      player_inc_timed(p,L'\b',uVar4 + L'\x01',true,true,false);
    }
    if (((flag & 0x10U) != 0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
      uVar4 = Rand_div(amount);
      player_inc_timed(p,L'\x04',uVar4 + L'\x01',true,true,true);
    }
    if (((flag & 0x20U) != 0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
      uVar4 = Rand_div(amount);
      player_inc_timed(p,L'\x06',uVar4 + L'\x01',true,true,true);
    }
    if (((flag & 0x40U) != 0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
      msg("You feel suddenly lethargic.");
      uVar4 = Rand_div(amount);
      player_inc_timed(p,L'\x01',uVar4 + L'\x01',true,true,false);
    }
    if (((char)flag < '\0') && (wVar3 = Rand_div(100), wVar3 < chance)) {
      uVar4 = Rand_div(amount);
      if (((((int)uVar4 < 8999) && (p->timed[0xc] != 0)) ||
          (wVar3 = (uVar4 - (p->state).dam_red) + L'\x01', wVar3 < L'\x01')) ||
         ((wVar1 = (p->state).perc_dam_red, wVar1 != L'\0' &&
          (iVar2 = (int)((ulong)((long)(wVar1 * wVar3) * -0x51eb851f) >> 0x20),
          wVar3 = ((iVar2 >> 5) - (iVar2 >> 0x1f)) + wVar3, wVar3 < L'\x01')))) {
        local_48[0x18] = '\0';
        local_48[0x19] = '\0';
        local_48[0x1a] = '\0';
        local_48[0x1b] = '\0';
        local_48[0x1c] = '\0';
        local_48[0x1d] = '\0';
        local_48[0x1e] = '\0';
        local_48[0x1f] = '\0';
        local_48[0x10] = '\0';
        local_48[0x11] = '\0';
        local_48[0x12] = '\0';
        local_48[0x13] = '\0';
        local_48[0x14] = '\0';
        local_48[0x15] = '\0';
        local_48[0x16] = '\0';
        local_48[0x17] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        local_48[0] = '\0';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        wVar3 = L'\0';
      }
      else {
        local_48[0x18] = '\0';
        local_48[0x19] = '\0';
        local_48[0x1a] = '\0';
        local_48[0x1b] = '\0';
        local_48[0x1c] = '\0';
        local_48[0x1d] = '\0';
        local_48[0x1e] = '\0';
        local_48[0x1f] = '\0';
        local_48[0x10] = '\0';
        local_48[0x11] = '\0';
        local_48[0x12] = '\0';
        local_48[0x13] = '\0';
        local_48[0x14] = '\0';
        local_48[0x15] = '\0';
        local_48[0x16] = '\0';
        local_48[0x17] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48[0xc] = '\0';
        local_48[0xd] = '\0';
        local_48[0xe] = '\0';
        local_48[0xf] = '\0';
        local_48[0] = '\0';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        if ((p->opts).opt[3] == true) {
          strnfmt(local_48,0x20," (%d)",(ulong)(uint)wVar3);
        }
      }
      msg("You cry out in sudden pain!%s",local_48);
      take_hit(p,wVar3,"over-exertion");
    }
  }
  return;
}

Assistant:

void player_over_exert(struct player *p, int flag, int chance, int amount)
{
	if (chance <= 0) return;

	/* CON damage */
	if (flag & PY_EXERT_CON) {
		if (randint0(100) < chance) {
			/* Hack - only permanent with high chance (no-mana casting) */
			bool perm = (randint0(100) < chance / 2) && (chance >= 50);
			msg("You have damaged your health!");
			player_stat_dec(p, STAT_CON, perm);
		}
	}

	/* Fainting */
	if (flag & PY_EXERT_FAINT) {
		if (randint0(100) < chance) {
			msg("You faint from the effort!");

			/* Bypass free action */
			(void)player_inc_timed(p, TMD_PARALYZED,
				randint1(amount), true, true, false);
		}
	}

	/* Scrambled stats */
	if (flag & PY_EXERT_SCRAMBLE) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_SCRAMBLE,
				randint1(amount), true, true, true);
		}
	}

	/* Cut damage */
	if (flag & PY_EXERT_CUT) {
		if (randint0(100) < chance) {
			msg("Wounds appear on your body!");
			(void)player_inc_timed(p, TMD_CUT, randint1(amount),
				true, true, false);
		}
	}

	/* Confusion */
	if (flag & PY_EXERT_CONF) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_CONFUSED,
				randint1(amount), true, true, true);
		}
	}

	/* Hallucination */
	if (flag & PY_EXERT_HALLU) {
		if (randint0(100) < chance) {
			(void)player_inc_timed(p, TMD_IMAGE, randint1(amount),
				true, true, true);
		}
	}

	/* Slowing */
	if (flag & PY_EXERT_SLOW) {
		if (randint0(100) < chance) {
			msg("You feel suddenly lethargic.");
			(void)player_inc_timed(p, TMD_SLOW, randint1(amount),
				true, true, false);
		}
	}

	/* HP */
	if (flag & PY_EXERT_HP) {
		if (randint0(100) < chance) {
			int dam = player_apply_damage_reduction(p,
				randint1(amount));
			char dam_text[32] = "";

			if (dam > 0 && OPT(p, show_damage)) {
				strnfmt(dam_text, sizeof(dam_text),
					" (%d)", dam);
			}
			msg("You cry out in sudden pain!%s", dam_text);
			take_hit(p, dam, "over-exertion");
		}
	}
}